

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O3

int big_file_mpi_broadcast_anyerror(int rt,MPI_Comm comm)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  int root;
  int rank;
  int loc;
  int errorlen;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_24 = rt;
  MPI_Comm_rank(comm,&local_30);
  local_2c = 0;
  if (rt != 0) {
    local_2c = local_30 + 1;
  }
  MPI_Allreduce(&local_2c,&local_34,1,&ompi_mpi_int,&ompi_mpi_op_max,comm);
  if (local_34 == 0) {
    local_24 = 0;
  }
  else {
    local_34 = local_34 + -1;
    __s = big_file_get_error_message();
    iVar1 = local_34;
    if (local_30 == local_34) {
      sVar2 = strlen(__s);
      local_28 = (int)sVar2;
    }
    MPI_Bcast(&local_28,1,&ompi_mpi_int,iVar1,comm);
    iVar1 = local_34;
    lVar3 = (long)local_28;
    if (local_30 != local_34) {
      __s = (char *)malloc(lVar3 + 1U);
    }
    MPI_Bcast(__s,lVar3 + 1U & 0xffffffff,&ompi_mpi_byte,iVar1,comm);
    if (local_30 != local_34) {
      big_file_set_error_message(__s);
      free(__s);
      local_30 = local_34;
    }
    MPI_Bcast(&local_24,1,&ompi_mpi_int,local_30,comm);
  }
  return local_24;
}

Assistant:

static int
big_file_mpi_broadcast_anyerror(int rt, MPI_Comm comm)
{
    int rank;
    MPI_Comm_rank(comm, &rank);
    int root, loc = 0;
    /* Add 1 so we do not swallow errors on rank 0*/
    if(rt != 0)
        loc = rank+1;

    MPI_Allreduce(&loc, &root, 1, MPI_INT, MPI_MAX, comm);

    if (root == 0) {
        /* no errors */
        return 0;
    }

    root -= 1;
    char * error = big_file_get_error_message();

    int errorlen;
    if(rank == root) {
        errorlen = strlen(error);
    }
    MPI_Bcast(&errorlen, 1, MPI_INT, root, comm);

    if(rank != root) {
        error = malloc(errorlen + 1);
    }

    MPI_Bcast(error, errorlen + 1, MPI_BYTE, root, comm);

    if(rank != root) {
        big_file_set_error_message(error);
        free(error);
    }

    MPI_Bcast(&rt, 1, MPI_INT, root, comm);

    return rt;
}